

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8 * google::protobuf::internal::WireFormat::InternalSerializeMessageSetItem
                  (FieldDescriptor *field,Message *message,uint8 *target,EpsCopyOutputStream *stream
                  )

{
  uint32 uVar1;
  int iVar2;
  uint8 *puVar3;
  Message *pMVar4;
  undefined4 extraout_var;
  Reflection *this;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  *puVar3 = '\v';
  uVar1 = *(uint32 *)(field + 0x44);
  puVar3[1] = '\x10';
  puVar3 = io::CodedOutputStream::WriteVarint32ToArray(uVar1,puVar3 + 2);
  pMVar4 = Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
  *puVar3 = '\x1a';
  uVar1 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[10])(pMVar4);
  puVar3 = io::CodedOutputStream::WriteVarint32ToArray(uVar1,puVar3 + 1);
  iVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[0xc])(pMVar4,puVar3,stream);
  puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 *)CONCAT44(extraout_var,iVar2));
  *puVar3 = '\f';
  return puVar3 + 1;
}

Assistant:

uint8* WireFormat::InternalSerializeMessageSetItem(
    const FieldDescriptor* field, const Message& message, uint8* target,
    io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  target = stream->EnsureSpace(target);
  // Start group.
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemStartTag, target);
  // Write type ID.
  target = WireFormatLite::WriteUInt32ToArray(
      WireFormatLite::kMessageSetTypeIdNumber, field->number(), target);
  // Write message.
  target = WireFormatLite::InternalWriteMessage(
      WireFormatLite::kMessageSetMessageNumber,
      message_reflection->GetMessage(message, field), target, stream);
  // End group.
  target = stream->EnsureSpace(target);
  target = io::CodedOutputStream::WriteTagToArray(
      WireFormatLite::kMessageSetItemEndTag, target);
  return target;
}